

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_make_filtration_non_decreasing_unit_test.cpp
# Opt level: O0

void __thiscall
make_filtration_non_decreasing_on_nan_values<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
::test_method(make_filtration_non_decreasing_on_nan_values<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *this)

{
  undefined8 uVar1;
  type_conflict2 tVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  lazy_ostream *plVar6;
  reference pvVar7;
  Filtration_value *pFVar8;
  double dVar9;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_430;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_410;
  assertion_result local_408;
  basic_cstring<const_char> local_3f0;
  basic_cstring<const_char> local_3e0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_3d0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  f_simplex_1;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0_1;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0_1;
  Complex_simplex_range *__range1_1;
  basic_cstring<const_char> local_350;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_340;
  assertion_result local_320;
  basic_cstring<const_char> local_308;
  basic_cstring<const_char> local_2f8;
  Filtration_value local_2e8 [2];
  Filtration_value *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [8];
  Filtration_value local_2c8;
  undefined1 local_2c4 [12];
  size_type local_2b8;
  undefined1 local_2b0 [8];
  Filtration_value local_2a8;
  undefined1 local_2a4 [12];
  size_type local_298;
  undefined1 local_290 [8];
  Filtration_value local_288;
  undefined1 local_284 [12];
  size_type local_278;
  undefined1 local_270 [8];
  Filtration_value local_268;
  undefined1 local_264 [12];
  pointer local_258;
  undefined1 local_250 [8];
  Filtration_value local_248;
  undefined1 local_244 [12];
  pointer local_238;
  undefined1 local_230 [24];
  basic_cstring<const_char> local_218;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_208;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_1e8;
  assertion_result local_1e0;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_1a8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  f_simplex;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0;
  Complex_simplex_range *__range1;
  float local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 *local_118;
  size_t local_110;
  undefined1 local_108 [24];
  undefined1 local_f0 [16];
  size_t local_e0;
  undefined1 local_c8 [20];
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 *local_a8;
  pointer local_a0;
  undefined1 local_98 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> st;
  make_filtration_non_decreasing_on_nan_values<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  *this_local;
  
  st._128_8_ = this;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  local_b4._0_1_ = true;
  local_b4._1_3_ = 0;
  local_b0 = 1;
  local_ac = 0;
  local_a8 = &local_b4;
  local_a0 = (pointer)0x3;
  dVar9 = std::numeric_limits<double>::quiet_NaN();
  local_c8._16_4_ = (undefined4)dVar9;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_c8,
             (initializer_list<int> *)local_98,(Filtration_value *)&local_a8);
  local_f0._0_4_ = 3;
  local_f0._4_4_ = 0;
  local_f0._8_8_ = local_f0;
  local_e0 = 2;
  dVar9 = std::numeric_limits<double>::quiet_NaN();
  local_108._20_4_ = (undefined4)dVar9;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_108,
             (initializer_list<int> *)local_98,(Filtration_value *)(local_f0 + 8));
  local_124 = 3;
  local_120 = 4;
  local_11c = 5;
  local_118 = &local_124;
  local_110 = 3;
  dVar9 = std::numeric_limits<double>::quiet_NaN();
  local_128 = (float)dVar9;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&__range1,
             (initializer_list<int> *)local_98,(Filtration_value *)&local_118);
  poVar5 = std::operator<<((ostream *)&std::clog,"SPECIFIC CASE:");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::clog,
                           "Insertion with NaN values does not ensure the filtration values are non decreasing"
                          );
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::make_filtration_non_decreasing
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  poVar5 = std::operator<<((ostream *)&std::clog,"Check all filtration values are NaN");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::complex_simplex_range
            ((Complex_simplex_range *)&__begin0.st_,
             (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
           *)&__end0.st_,
          (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0.st_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
         *)&f_simplex,
        (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0.st_);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__end0.st_,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&f_simplex);
    if (!tVar2) break;
    pvVar7 = boost::iterators::detail::
             iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                          *)&__end0.st_);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_1a8,pvVar7);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c8);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b8,0x92,&local_1c8);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator(&local_1e8,&local_1a8);
      pFVar8 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                         (&local_1e8);
      iVar4 = std::isnan((double)(ulong)(uint)*pFVar8);
      boost::test_tools::assertion_result::assertion_result(&local_1e0,SUB41(iVar4,0));
      plVar6 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_218,"std::isnan(st.filtration(f_simplex))",0x24);
      boost::unit_test::operator<<(&local_208,plVar6,&local_218);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)(local_230 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::test_tools::tt_detail::report_assertion(&local_1e0,&local_208,local_230 + 8,0x92,1,0,0)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_208);
      boost::test_tools::assertion_result::~assertion_result(&local_1e0);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                  *)&__end0.st_);
  }
  local_244._0_4_ = 0;
  local_244._4_8_ = local_244;
  local_238 = (pointer)0x1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_230,
             (initializer_list<int> *)local_98);
  local_248 = 0.0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (Simplex_handle *)local_230,&local_248);
  local_264._0_4_ = 1;
  local_264._4_8_ = local_264;
  local_258 = (pointer)0x1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_250,
             (initializer_list<int> *)local_98);
  local_268 = 0.0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (Simplex_handle *)local_250,&local_268);
  local_284._0_4_ = 2;
  local_284._4_8_ = local_284;
  local_278 = 1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_270,
             (initializer_list<int> *)local_98);
  local_288 = 0.0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (Simplex_handle *)local_270,&local_288);
  local_2a4._0_4_ = 3;
  local_2a4._4_8_ = local_2a4;
  local_298 = 1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_290,
             (initializer_list<int> *)local_98);
  local_2a8 = 0.0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (Simplex_handle *)local_290,&local_2a8);
  local_2c4._0_4_ = 4;
  local_2c4._4_8_ = local_2c4;
  local_2b8 = 1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_2b0,
             (initializer_list<int> *)local_98);
  local_2c8 = 0.0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (Simplex_handle *)local_2b0,&local_2c8);
  local_2e8[1] = 7.00649e-45;
  local_2e0 = local_2e8 + 1;
  local_2d8 = 1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_2d0,
             (initializer_list<int> *)local_98);
  local_2e8[0] = 0.0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::assign_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
             (Simplex_handle *)local_2d0,local_2e8);
  poVar5 = std::operator<<((ostream *)&std::clog,
                           "Check make_filtration_non_decreasing is modifying the simplicial complex"
                          );
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_308);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f8,0x9d,&local_308);
    bVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
            make_filtration_non_decreasing
                      ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
    boost::test_tools::assertion_result::assertion_result(&local_320,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,"st.make_filtration_non_decreasing()",0x23);
    boost::unit_test::operator<<(&local_340,plVar6,&local_350);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&__range1_1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
               ,0x95);
    boost::test_tools::tt_detail::report_assertion(&local_320,&local_340,&__range1_1,0x9d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_340);
    boost::test_tools::assertion_result::~assertion_result(&local_320);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  poVar5 = std::operator<<((ostream *)&std::clog,"Check all filtration values are now defined");
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::complex_simplex_range
            ((Complex_simplex_range *)&__begin0_1.st_,
             (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
           *)&__end0_1.st_,
          (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__begin0_1.st_);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
         *)&f_simplex_1,
        (iterator_range_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
         *)&__begin0_1.st_);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&__end0_1.st_,
                       (iterator_facade<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long>
                        *)&f_simplex_1);
    if (!tVar2) break;
    pvVar7 = boost::iterators::detail::
             iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
             ::operator*((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                          *)&__end0_1.st_);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_3d0,pvVar7);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3f0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3e0,0xa1,&local_3f0);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::vec_iterator(&local_410,&local_3d0);
      pFVar8 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                         (&local_410);
      iVar4 = std::isnan((double)(ulong)(uint)*pFVar8);
      boost::test_tools::assertion_result::assertion_result(&local_408,(bool)((byte)iVar4 ^ 1));
      plVar6 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_440,"!std::isnan(st.filtration(f_simplex))",0x25);
      boost::unit_test::operator<<(&local_430,plVar6,&local_440);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_450,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_make_filtration_non_decreasing_unit_test.cpp"
                 ,0x95);
      boost::test_tools::tt_detail::report_assertion(&local_408,&local_430,&local_450,0xa1,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_430);
      boost::test_tools::assertion_result::~assertion_result(&local_408);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    boost::iterators::detail::
    iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_boost::iterators::forward_traversal_tag,_const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_&,_long,_false,_false>
                  *)&__end0_1.st_);
  }
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(make_filtration_non_decreasing_on_nan_values, typeST, list_of_tested_variants) {
  typeST st;

  st.insert_simplex_and_subfaces({2, 1, 0}, std::numeric_limits<double>::quiet_NaN());
  st.insert_simplex_and_subfaces({3, 0},    std::numeric_limits<double>::quiet_NaN());
  st.insert_simplex_and_subfaces({3, 4, 5}, std::numeric_limits<double>::quiet_NaN());
  
  /* Inserted simplex:     */
  /*    1                  */
  /*    o                  */
  /*   /X\                 */
  /*  o---o---o---o        */
  /*  2   0   3\X/4        */
  /*            o          */
  /*            5          */

  std::clog << "SPECIFIC CASE:" << std::endl;
  std::clog << "Insertion with NaN values does not ensure the filtration values are non decreasing" << std::endl;
  st.make_filtration_non_decreasing();

  std::clog << "Check all filtration values are NaN" << std::endl;
  for (auto f_simplex : st.complex_simplex_range()) {
    BOOST_CHECK(std::isnan(st.filtration(f_simplex)));
  }

  st.assign_filtration(st.find({0}), 0.);
  st.assign_filtration(st.find({1}), 0.);
  st.assign_filtration(st.find({2}), 0.);
  st.assign_filtration(st.find({3}), 0.);
  st.assign_filtration(st.find({4}), 0.);
  st.assign_filtration(st.find({5}), 0.);

  std::clog << "Check make_filtration_non_decreasing is modifying the simplicial complex" << std::endl;
  BOOST_CHECK(st.make_filtration_non_decreasing());
  
  std::clog << "Check all filtration values are now defined" << std::endl;
  for (auto f_simplex : st.complex_simplex_range()) {
    BOOST_CHECK(!std::isnan(st.filtration(f_simplex)));
  }
}